

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infomessages.cpp
# Opt level: O2

void __thiscall CInfoMessages::OnMessage(CInfoMessages *this,int MsgType,void *pRawMsg)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  IGraphics *pIVar4;
  CNetObj_GameDataRace *pCVar5;
  CSkins *this_00;
  CNetObj_GameDataFlag *pCVar6;
  IConsole *pIVar7;
  ITextRender *pIVar8;
  int iVar9;
  int v;
  CSkin *pCVar10;
  CGameClient *pCVar11;
  char *pcVar12;
  CInfoMsg *this_01;
  long lVar13;
  long in_FS_OFFSET;
  anon_union_4_2_94730227_for_vector4_base<float>_1 aVar14;
  undefined4 uVar15;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aVar16;
  uint uVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  vec4 vVar20;
  CInfoMsg local_ae0;
  char aDiff [32];
  char aLabel [64];
  char aTime [32];
  char aBuf [256];
  CInfoMsg local_650;
  char aImprovement [64];
  undefined1 local_2d0 [156];
  uint local_234;
  undefined1 local_230 [72];
  float local_1e8;
  undefined4 local_1c8 [13];
  anon_union_4_2_94730227_for_vector4_base<float>_1 aStack_194;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aStack_190;
  float afStack_18c [26];
  int local_124;
  undefined8 local_120;
  undefined1 local_118 [72];
  float local_d0;
  undefined1 local_b0 [72];
  float local_68;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar11 = (this->super_CComponent).m_pClient;
  if (pCVar11->m_SuppressEvents != false) goto LAB_0013e6e7;
  pIVar4 = pCVar11->m_pGraphics;
  uVar1 = pIVar4->m_ScreenWidth;
  uVar2 = pIVar4->m_ScreenHeight;
  (*(pIVar4->super_IInterface)._vptr_IInterface[5])
            (0,0,((float)(int)uVar1 / (float)(int)uVar2) * 1200.0 * 1.5,0x44e10000);
  pCVar11 = (this->super_CComponent).m_pClient;
  uVar17 = (pCVar11->m_GameInfo).m_GameFlags;
  if (MsgType == 0x23) {
    if ((uVar17 & 8) == 0) goto LAB_0013e6e7;
    pCVar5 = (pCVar11->m_Snap).m_pGameDataRace;
    if (pCVar5 == (CNetObj_GameDataRace *)0x0) {
      iVar9 = 3;
    }
    else {
      iVar9 = pCVar5->m_Precision;
    }
    FormatTime(aTime,0x20,*(int *)((long)pRawMsg + 4),iVar9);
    pCVar11 = (this->super_CComponent).m_pClient;
    CGameClient::GetPlayerLabel(pCVar11,aLabel,0x40,*pRawMsg,pCVar11->m_aClients[*pRawMsg].m_aName);
    str_format(aBuf,0x100,"%2d: %s: finished in %s",(long)*pRawMsg,
               ((this->super_CComponent).m_pClient)->m_aClients[*pRawMsg].m_aName,aTime);
    pIVar7 = ((this->super_CComponent).m_pClient)->m_pConsole;
    (*(pIVar7->super_IInterface)._vptr_IInterface[0x19])(pIVar7,0,"race",aBuf,0);
    pcVar12 = "\'%s\' has set a new map record: %s";
    if (*(int *)((long)pRawMsg + 0xc) == 0) {
      if (*(int *)((long)pRawMsg + 0x10) != 0) goto LAB_0013e357;
    }
    else {
      if (*(int *)((long)pRawMsg + 0x10) == 0) {
        pcVar12 = "\'%s\' has set a new personal record: %s";
      }
LAB_0013e357:
      pcVar12 = Localize(pcVar12,"");
      str_format(aBuf,0x100,pcVar12);
      if (*(int *)((long)pRawMsg + 8) < 0) {
        pCVar5 = (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataRace;
        if (pCVar5 == (CNetObj_GameDataRace *)0x0) {
          iVar9 = 3;
        }
        else {
          iVar9 = pCVar5->m_Precision;
        }
        FormatTimeDiff(aDiff,0x20,-*(int *)((long)pRawMsg + 8),iVar9,false);
        pcVar12 = Localize(" (%s seconds faster)","");
        str_format(aImprovement,0x40,pcVar12);
        str_append(aBuf,aImprovement,0x100);
      }
      CChat::AddLine(((this->super_CComponent).m_pClient)->m_pChat,aBuf,-1,0,-1);
    }
    pCVar5 = (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataRace;
    if ((pCVar5 != (CNetObj_GameDataRace *)0x0) && ((pCVar5->m_RaceFlags & 2) != 0)) {
      if ((*(int *)((long)pRawMsg + 0xc) == 0) && (*(int *)((long)pRawMsg + 0x10) == 0)) {
        pcVar12 = Localize("\'%s\' finished in: %s","");
        str_format(aBuf,0x100,pcVar12,aLabel,aTime);
        CChat::AddLine(((this->super_CComponent).m_pClient)->m_pChat,aBuf,-1,0,-1);
      }
      goto LAB_0013e6e7;
    }
    CInfoMsg::CInfoMsg((CInfoMsg *)aImprovement);
    aImprovement._8_4_ = *pRawMsg;
    pCVar11 = (this->super_CComponent).m_pClient;
    memcpy(local_2d0,&pCVar11->m_aClients[(int)aImprovement._8_4_].m_RenderInfo,0x9c);
    local_d0 = 36.0;
    if (*(int *)((long)pRawMsg + 0x10) == 0) {
      if (*(int *)((long)pRawMsg + 0xc) != 0) {
        uVar19 = 0x3f800000;
        uVar17 = 0x3f19999a;
        uVar15 = 0x3e4ccccd;
        goto LAB_0013e53e;
      }
    }
    else {
      uVar19 = 0;
      uVar17 = 0x3f000000;
      uVar15 = 0x3f800000;
LAB_0013e53e:
      (*(pCVar11->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                (uVar15,(ulong)uVar17,uVar19,0x3f800000);
    }
    pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar8->super_IInterface)._vptr_IInterface[7])(pIVar8,local_118,aTime,0xffffffffffffffff);
    pCVar11 = (this->super_CComponent).m_pClient;
    if (pCVar11->m_pConfig->m_ClShowsocial != 0) {
      (*(pCVar11->m_pTextRender->super_IInterface)._vptr_IInterface[7])
                (pCVar11->m_pTextRender,aImprovement + 0x10,pCVar11->m_aClients[*pRawMsg].m_aName,
                 0xffffffffffffffff);
      pCVar11 = (this->super_CComponent).m_pClient;
    }
    pCVar5 = (pCVar11->m_Snap).m_pGameDataRace;
    if (pCVar5 == (CNetObj_GameDataRace *)0x0) {
      iVar9 = 3;
    }
    else {
      iVar9 = pCVar5->m_Precision;
    }
    FormatTimeDiff(aTime,0x20,*(int *)((long)pRawMsg + 8),iVar9,true);
    str_format(aBuf,0x100,"(%s)",aTime);
    local_68 = 36.0;
    uVar15 = 0x3f000000;
    uVar17 = 0x3f800000;
    if (-1 < *(int *)((long)pRawMsg + 8)) {
      uVar15 = 0x3f800000;
      uVar17 = 0x3f000000;
    }
    (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
              (uVar15,(ulong)uVar17);
    pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar8->super_IInterface)._vptr_IInterface[7])(pIVar8,local_b0,aBuf,0xffffffffffffffff);
    (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
              (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    local_120 = *(undefined8 *)((long)pRawMsg + 4);
    local_48 = *(undefined8 *)((long)pRawMsg + 0xc);
    CInfoMsg::CInfoMsg(&local_ae0,(CInfoMsg *)aImprovement);
    AddInfoMsg(this,1,&local_ae0);
    this_01 = &local_ae0;
  }
  else {
    if ((MsgType != 5) ||
       ((((uVar17 & 8) != 0 &&
         (pCVar5 = (pCVar11->m_Snap).m_pGameDataRace, pCVar5 != (CNetObj_GameDataRace *)0x0)) &&
        ((pCVar5->m_RaceFlags & 1) != 0)))) goto LAB_0013e6e7;
    CInfoMsg::CInfoMsg((CInfoMsg *)aImprovement);
    aImprovement._8_4_ = *(int *)((long)pRawMsg + 4);
    pCVar11 = (this->super_CComponent).m_pClient;
    if (pCVar11->m_pConfig->m_ClShowsocial != 0) {
      (*(pCVar11->m_pTextRender->super_IInterface)._vptr_IInterface[7])
                (pCVar11->m_pTextRender,aImprovement + 0x10,
                 pCVar11->m_aClients[(int)aImprovement._8_4_].m_aName,0xffffffffffffffff);
      pCVar11 = (this->super_CComponent).m_pClient;
    }
    memcpy(local_2d0,&pCVar11->m_aClients[(int)aImprovement._8_4_].m_RenderInfo,0x9c);
    uVar17 = *pRawMsg;
    local_234 = uVar17;
    if ((long)(int)uVar17 < 0) {
      uVar3 = (pCVar11->m_GameInfo).m_GameFlags;
      iVar9 = CSkins::Find(pCVar11->m_pSkins,"dummy",false);
      pCVar11 = (this->super_CComponent).m_pClient;
      if (iVar9 != -1) {
        pCVar10 = CSkins::Get(pCVar11->m_pSkins,iVar9);
        iVar9 = 0;
        for (lVar13 = 0; lVar13 != 0x18; lVar13 = lVar13 + 4) {
          *(undefined4 *)((long)local_1c8 + lVar13) =
               *(undefined4 *)(*(long *)((long)pCVar10->m_apParts + lVar13 * 2) + 0x68);
          this_00 = ((this->super_CComponent).m_pClient)->m_pSkins;
          if ((uVar3 & 1) == 0) {
            vVar20 = CSkins::GetColorV4(this_00,0,lVar13 == 4);
            uVar18 = vVar20._8_8_;
            aVar14 = vVar20.field_0;
            aVar16 = vVar20.field_1;
          }
          else {
            v = CSkins::GetTeamColor(this_00,0,0,~uVar17,iVar9);
            vVar20 = CSkins::GetColorV4(((this->super_CComponent).m_pClient)->m_pSkins,v,lVar13 == 4
                                       );
            uVar18 = vVar20._8_8_;
            aVar14 = vVar20.field_0;
            aVar16 = vVar20.field_1;
          }
          (&aStack_194)[lVar13] = aVar14;
          (&aStack_190)[lVar13] = aVar16;
          afStack_18c[lVar13] = (float)uVar18;
          afStack_18c[lVar13 + 1] = (float)((ulong)uVar18 >> 0x20);
          afStack_18c[lVar13 + 1] = afStack_18c[lVar13 + 1] * 0.5;
          iVar9 = iVar9 + 1;
        }
        afStack_18c[0x16] = 64.0;
        pCVar11 = (this->super_CComponent).m_pClient;
      }
    }
    else {
      if (pCVar11->m_pConfig->m_ClShowsocial != 0) {
        local_1e8 = 36.0;
        (*(pCVar11->m_pTextRender->super_IInterface)._vptr_IInterface[7])
                  (pCVar11->m_pTextRender,local_230,pCVar11->m_aClients[(int)uVar17].m_aName,
                   0xffffffffffffffff);
        pCVar11 = (this->super_CComponent).m_pClient;
      }
      memcpy(local_1c8,&pCVar11->m_aClients[(int)local_234].m_RenderInfo,0x9c);
    }
    afStack_18c._96_8_ = *(undefined8 *)((long)pRawMsg + 8);
    pCVar6 = (pCVar11->m_Snap).m_pGameDataFlag;
    if (pCVar6 == (CNetObj_GameDataFlag *)0x0) {
      local_124 = -1;
    }
    else {
      local_124 = pCVar6->m_FlagCarrierBlue;
    }
    CInfoMsg::CInfoMsg(&local_650,(CInfoMsg *)aImprovement);
    AddInfoMsg(this,0,&local_650);
    this_01 = &local_650;
  }
  CInfoMsg::~CInfoMsg(this_01);
  CInfoMsg::~CInfoMsg((CInfoMsg *)aImprovement);
LAB_0013e6e7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CInfoMessages::OnMessage(int MsgType, void *pRawMsg)
{
	if(m_pClient->m_SuppressEvents)
		return;

	// hint TextRender to render text, deferred, with correct fontsize
	float Width = 400*3.0f*Graphics()->ScreenAspect();
	float Height = 400*3.0f;
	Graphics()->MapScreen(0, 0, Width*1.5f, Height*1.5f);

	bool Race = m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_RACE;

	if(MsgType == NETMSGTYPE_SV_KILLMSG)
	{
		if(Race && m_pClient->m_Snap.m_pGameDataRace && m_pClient->m_Snap.m_pGameDataRace->m_RaceFlags&RACEFLAG_HIDE_KILLMSG)
			return;

		CNetMsg_Sv_KillMsg *pMsg = (CNetMsg_Sv_KillMsg *)pRawMsg;

		// unpack messages
		CInfoMsg Kill;
		Kill.m_Player1ID = pMsg->m_Victim;
		if(Config()->m_ClShowsocial)
		{
			Kill.m_Player1NameCursor.m_FontSize = 36.0f;
			TextRender()->TextDeferred(&Kill.m_Player1NameCursor, m_pClient->m_aClients[Kill.m_Player1ID].m_aName, -1);
		}

		Kill.m_Player1RenderInfo = m_pClient->m_aClients[Kill.m_Player1ID].m_RenderInfo;

		Kill.m_Player2ID = pMsg->m_Killer;
		if(Kill.m_Player2ID >= 0)
		{
			if(Config()->m_ClShowsocial)
			{
				Kill.m_Player2NameCursor.m_FontSize = 36.0f;
				TextRender()->TextDeferred(&Kill.m_Player2NameCursor, m_pClient->m_aClients[Kill.m_Player2ID].m_aName, -1);
			}

			Kill.m_Player2RenderInfo = m_pClient->m_aClients[Kill.m_Player2ID].m_RenderInfo;
		}
		else
		{
			bool IsTeamplay = (m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS) != 0;
			int KillerTeam = - 1 - Kill.m_Player2ID;
			int Skin = m_pClient->m_pSkins->Find("dummy", false);
			if(Skin != -1)
			{
				const CSkins::CSkin *pDummy = m_pClient->m_pSkins->Get(Skin);
				for(int p = 0; p < NUM_SKINPARTS; p++)
				{
					Kill.m_Player2RenderInfo.m_aTextures[p] = pDummy->m_apParts[p]->m_OrgTexture;
					if(IsTeamplay)
					{
						int ColorVal = m_pClient->m_pSkins->GetTeamColor(0, 0x000000, KillerTeam, p);
						Kill.m_Player2RenderInfo.m_aColors[p] = m_pClient->m_pSkins->GetColorV4(ColorVal, p==SKINPART_MARKING);
					}
					else
						Kill.m_Player2RenderInfo.m_aColors[p] = m_pClient->m_pSkins->GetColorV4(0x000000, p==SKINPART_MARKING);
					Kill.m_Player2RenderInfo.m_aColors[p].a *= .5f;
				}
				Kill.m_Player2RenderInfo.m_Size = 64.0f;
			}
		}

		Kill.m_Weapon = pMsg->m_Weapon;
		Kill.m_ModeSpecial = pMsg->m_ModeSpecial;
		Kill.m_FlagCarrierBlue = m_pClient->m_Snap.m_pGameDataFlag ? m_pClient->m_Snap.m_pGameDataFlag->m_FlagCarrierBlue : -1;

		AddInfoMsg(INFOMSG_KILL, Kill);
	}
	else if(MsgType == NETMSGTYPE_SV_RACEFINISH && Race)
	{
		CNetMsg_Sv_RaceFinish *pMsg = (CNetMsg_Sv_RaceFinish *)pRawMsg;

		char aBuf[256];
		char aTime[32];
		char aLabel[64];

		FormatTime(aTime, sizeof(aTime), pMsg->m_Time, m_pClient->RacePrecision());
		m_pClient->GetPlayerLabel(aLabel, sizeof(aLabel), pMsg->m_ClientID, m_pClient->m_aClients[pMsg->m_ClientID].m_aName);

		str_format(aBuf, sizeof(aBuf), "%2d: %s: finished in %s", pMsg->m_ClientID, m_pClient->m_aClients[pMsg->m_ClientID].m_aName, aTime);
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "race", aBuf);

		if(pMsg->m_RecordPersonal || pMsg->m_RecordServer)
		{
			if(pMsg->m_RecordServer)
				str_format(aBuf, sizeof(aBuf), Localize("'%s' has set a new map record: %s"), aLabel, aTime);
			else // m_RecordPersonal
				str_format(aBuf, sizeof(aBuf), Localize("'%s' has set a new personal record: %s"), aLabel, aTime);
			
			if(pMsg->m_Diff < 0)
			{
				char aImprovement[64];
				char aDiff[32];
				FormatTimeDiff(aDiff, sizeof(aDiff), absolute(pMsg->m_Diff), m_pClient->RacePrecision(), false);
				str_format(aImprovement, sizeof(aImprovement), Localize(" (%s seconds faster)"), aDiff);
				str_append(aBuf, aImprovement, sizeof(aBuf));
			}

			m_pClient->m_pChat->AddLine(aBuf);
		}

		if(m_pClient->m_Snap.m_pGameDataRace && m_pClient->m_Snap.m_pGameDataRace->m_RaceFlags&RACEFLAG_FINISHMSG_AS_CHAT)
		{
			if(!pMsg->m_RecordPersonal && !pMsg->m_RecordServer) // don't print the time twice
			{
				str_format(aBuf, sizeof(aBuf), Localize("'%s' finished in: %s"), aLabel, aTime);
				m_pClient->m_pChat->AddLine(aBuf);
			}
		}
		else
		{
			CInfoMsg Finish;
			Finish.m_Player1ID = pMsg->m_ClientID;
			Finish.m_Player1RenderInfo = m_pClient->m_aClients[Finish.m_Player1ID].m_RenderInfo;
			
			Finish.m_TimeCursor.m_FontSize = 36.0f;
			if(pMsg->m_RecordServer)
				TextRender()->TextColor(1.0f, 0.5f, 0.0f, 1.0f);
			else if(pMsg->m_RecordPersonal)
				TextRender()->TextColor(0.2f, 0.6f, 1.0f, 1.0f);
			TextRender()->TextDeferred(&Finish.m_TimeCursor, aTime, -1);

			if(Config()->m_ClShowsocial)
			{
				Finish.m_Player1NameCursor.m_FontSize = 36.0f;
				TextRender()->TextDeferred(&Finish.m_Player1NameCursor, m_pClient->m_aClients[pMsg->m_ClientID].m_aName, -1);
			}

			FormatTimeDiff(aTime, sizeof(aTime), pMsg->m_Diff, m_pClient->RacePrecision());
			str_format(aBuf, sizeof(aBuf), "(%s)", aTime);
			Finish.m_DiffCursor.m_FontSize = 36.0f;
			if(pMsg->m_Diff < 0)
				TextRender()->TextColor(0.5f, 1.0f, 0.5f, 1.0f);
			else
				TextRender()->TextColor(1.0f, 0.5f, 0.5f, 1.0f);
			TextRender()->TextDeferred(&Finish.m_DiffCursor, aBuf, -1);
			TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);

			Finish.m_Time = pMsg->m_Time;
			Finish.m_Diff = pMsg->m_Diff;
			Finish.m_RecordPersonal = pMsg->m_RecordPersonal;
			Finish.m_RecordServer = pMsg->m_RecordServer;

			AddInfoMsg(INFOMSG_FINISH, Finish);
		}
	}
}